

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto_helpers.h
# Opt level: O1

int test_helper_is_psa_pristine(int line,char *file)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  mbedtls_psa_stats_t stats;
  mbedtls_psa_stats_t local_48;
  
  mbedtls_psa_get_stats(&local_48);
  iVar2 = 0;
  bVar1 = true;
  if (local_48.volatile_slots == 0) {
    if (local_48.persistent_slots == 0) {
      if (local_48.external_slots == 0) {
        pcVar3 = (char *)0x0;
        if (local_48.half_filled_slots == 0) {
          iVar2 = 1;
          bVar1 = false;
        }
        else {
          pcVar3 = "A half-filled slot has not been cleared properly.";
          iVar2 = 0;
        }
      }
      else {
        pcVar3 = "An external slot has not been closed properly.";
      }
    }
    else {
      pcVar3 = "A persistent slot has not been closed properly.";
      iVar2 = 0;
    }
  }
  else {
    pcVar3 = "A volatile slot has not been closed properly.";
    iVar2 = 0;
  }
  if ((bVar1) && (test_info.result == TEST_RESULT_SUCCESS)) {
    test_info.result = TEST_RESULT_FAILED;
    test_info.filename =
         "/workspace/llm4binary/github/license_c_cmakelists/ARMmbed[P]mbed-crypto/tests/suites/test_suite_psa_crypto_slot_management.function"
    ;
    test_info.test = pcVar3;
    test_info.line_no = line;
  }
  return iVar2;
}

Assistant:

static int test_helper_is_psa_pristine( int line, const char *file )
{
    mbedtls_psa_stats_t stats;
    const char *msg = NULL;

    mbedtls_psa_get_stats( &stats );

    if( stats.volatile_slots != 0 )
        msg = "A volatile slot has not been closed properly.";
    else if( stats.persistent_slots != 0 )
        msg = "A persistent slot has not been closed properly.";
    else if( stats.external_slots != 0 )
        msg = "An external slot has not been closed properly.";
    else if( stats.half_filled_slots != 0 )
        msg = "A half-filled slot has not been cleared properly.";

    /* If the test has already failed, don't overwrite the failure
     * information. Do keep the stats lookup above, because it can be
     * convenient to break on it when debugging a failure. */
    if( msg != NULL && test_info.result == TEST_RESULT_SUCCESS )
        test_fail( msg, line, file );

    return( msg == NULL );
}